

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O1

sc_signed * sc_dt::operator-(sc_signed *__return_storage_ptr__,uint64 u,sc_unsigned *v)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  size_t __n;
  sc_digit ud [3];
  
  if (u == 0) {
    sc_signed::sc_signed(__return_storage_ptr__,v,-v->sgn);
  }
  else {
    __n = 0xc;
    uVar2 = 0;
    do {
      uVar3 = uVar2;
      ud[uVar3] = (uint)u & 0x3fffffff;
      __n = __n - 4;
      if (1 < uVar3) break;
      bVar1 = 0x3fffffff < u;
      uVar2 = uVar3 + 1;
      u = u >> 0x1e;
    } while (bVar1);
    if (uVar3 < 2) {
      memset(ud + uVar3 + 1,0,__n);
    }
    if (v->sgn == 0) {
      sc_signed::sc_signed(__return_storage_ptr__,1,0x40,3,ud,false);
    }
    else {
      add_signed_friend(__return_storage_ptr__,1,0x40,3,ud,-v->sgn,v->nbits,v->ndigits,v->digit);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator-(uint64 u, const sc_unsigned& v)
{

  if (u == 0) // case 1
    return sc_signed(v, -v.sgn);

  CONVERT_INT64(u);

  if (v.sgn == SC_ZERO) // case 2
    return sc_signed(us, BITS_PER_UINT64, DIGITS_PER_UINT64, ud, false);

  // cases 3 and 4
  return add_signed_friend(us, BITS_PER_UINT64, DIGITS_PER_UINT64, ud,
                           -v.sgn, v.nbits, v.ndigits, v.digit);

}